

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O3

int test_setsockopt_impl
              (char *file,int line,int sock,int level,int option,void *optval,size_t optlen)

{
  int iVar1;
  
  iVar1 = nn_setsockopt(line,0,sock,level,4);
  if (-1 < iVar1) {
    return iVar1;
  }
  test_setsockopt_impl_cold_1();
}

Assistant:

static int NN_UNUSED test_setsockopt_impl (char *file, int line,
    int sock, int level, int option, const void *optval, size_t optlen)
{
    int rc;

    rc = nn_setsockopt (sock, level, option, optval, optlen);
    if(rc < 0) {
        fprintf (stderr, "Failed set option \"%d\": %s [%d] (%s:%d)\n",
            option,
            nn_err_strerror (errno),
            (int) errno, file, line);
        nn_err_abort ();
    }
    return rc;
}